

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

bool __thiscall
re2::Tester::TestCase(Tester *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  bool bVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  bool bVar4;
  ulong uVar5;
  
  ppTVar2 = (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar3 == ppTVar2) {
    bVar4 = true;
  }
  else {
    bVar4 = true;
    uVar5 = 0;
    do {
      if (ppTVar2[uVar5]->error_ == false) {
        bVar1 = TestInstance::RunCase(ppTVar2[uVar5],text,context,anchor);
        ppTVar2 = (this->v_).
                  super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar3 = (this->v_).
                  super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        bVar1 = false;
      }
      bVar4 = (bool)(bVar4 & bVar1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppTVar3 - (long)ppTVar2 >> 3));
  }
  return bVar4;
}

Assistant:

bool Tester::TestCase(const StringPiece& text, const StringPiece& context,
                         Prog::Anchor anchor) {
  bool okay = true;
  for (size_t i = 0; i < v_.size(); i++)
    okay &= (!v_[i]->error() && v_[i]->RunCase(text, context, anchor));
  return okay;
}